

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

bool __thiscall
gui::MultilineTextBox::insertCharacter(MultilineTextBox *this,uint32_t unicode,bool suppressSignals)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  const_iterator __position;
  bool bVar4;
  byte bVar5;
  size_t sVar6;
  size_type sVar7;
  size_t sVar8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__s;
  undefined1 in_DL;
  int in_ESI;
  long in_RDI;
  wregex regex;
  size_t i;
  size_t count;
  size_t caretOffset;
  size_t y;
  pair<sf::Vector2<unsigned_long>,_sf::Vector2<unsigned_long>_> selection;
  bool clearedSelection;
  bool textChanged;
  Vector2<unsigned_long> lastCaretPosition;
  Vector2<unsigned_long> lastScroll;
  vector<sf::String,_std::allocator<sf::String>_> lastBoxStrings;
  String *in_stack_fffffffffffffb98;
  basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbac;
  undefined1 in_stack_fffffffffffffbad;
  undefined1 in_stack_fffffffffffffbae;
  undefined1 in_stack_fffffffffffffbaf;
  Vector2<unsigned_long> *in_stack_fffffffffffffbb0;
  undefined1 uVar9;
  const_iterator in_stack_fffffffffffffbb8;
  MultilineTextBox *in_stack_fffffffffffffbc0;
  Widget *in_stack_fffffffffffffbc8;
  Signal<gui::Widget_*,_unsigned_long> *in_stack_fffffffffffffbd0;
  MultilineTextBox *in_stack_fffffffffffffbd8;
  MultilineTextBox *in_stack_fffffffffffffbe0;
  String *in_stack_fffffffffffffbe8;
  iterator in_stack_fffffffffffffbf0;
  String *in_stack_fffffffffffffbf8;
  undefined6 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2e;
  undefined1 in_stack_fffffffffffffc2f;
  vector<sf::String,_std::allocator<sf::String>_> *in_stack_fffffffffffffc38;
  vector<sf::String,_std::allocator<sf::String>_> *in_stack_fffffffffffffc40;
  wstring local_318 [32];
  wstring local_2f8 [64];
  locale local_2b8 [15];
  undefined1 in_stack_fffffffffffffd57;
  Vector2<unsigned_long> *in_stack_fffffffffffffd58;
  MultilineTextBox *in_stack_fffffffffffffd60;
  ulong local_248;
  size_type local_b8;
  size_type local_a8;
  ulong local_98;
  bool local_89;
  locale local_88 [40];
  Vector2<unsigned_long> local_60 [2];
  Vector2<unsigned_long> local_40 [2];
  undefined1 in_stack_ffffffffffffffe3;
  uint32_t in_stack_ffffffffffffffe4;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar10;
  undefined4 uVar11;
  bool local_1;
  
  uVar10 = CONCAT13(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  if ((*(byte *)(in_RDI + 0x2f8) & 1) == 0) {
    std::vector<sf::String,_std::allocator<sf::String>_>::vector
              ((vector<sf::String,_std::allocator<sf::String>_> *)0x1a2194);
    sf::Vector2<unsigned_long>::Vector2(local_40);
    sf::Vector2<unsigned_long>::Vector2(local_60);
    std::locale::locale(local_88);
    sf::String::String(in_stack_fffffffffffffbf0._M_current,(char *)in_stack_fffffffffffffbe8,
                       (locale *)in_stack_fffffffffffffbe0);
    bVar4 = sf::operator!=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    sf::String::~String((String *)0x1a2226);
    std::locale::~locale(local_88);
    if (bVar4) {
      std::vector<sf::String,_std::allocator<sf::String>_>::operator=
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      local_40[0].x = *(unsigned_long *)(in_RDI + 0x378);
      local_40[0].y = *(unsigned_long *)(in_RDI + 0x380);
      local_60[0].x = *(unsigned_long *)(in_RDI + 0x388);
      local_60[0].y = *(unsigned_long *)(in_RDI + 0x390);
    }
    local_89 = false;
    if ((*(byte *)(in_RDI + 0x3c8) & 1) != 0) {
      anon_unknown.dwarf_12ad49::sortByYFirst<unsigned_long>
                (in_stack_fffffffffffffbb0,
                 (Vector2<unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffffbaf,
                          CONCAT16(in_stack_fffffffffffffbae,
                                   CONCAT15(in_stack_fffffffffffffbad,
                                            CONCAT14(in_stack_fffffffffffffbac,
                                                     in_stack_fffffffffffffba8)))));
      for (local_b8 = local_a8; local_b8 <= local_98; local_b8 = local_b8 + 1) {
        if (local_b8 == local_a8) {
          if (local_b8 == local_98) {
            std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                      ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_b8)
            ;
            sf::String::substring
                      (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                       (size_t)in_stack_fffffffffffffbd8);
            std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                      ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_b8)
            ;
            sf::String::substring
                      (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                       (size_t)in_stack_fffffffffffffbd8);
            sf::operator+((String *)in_stack_fffffffffffffbc8,(String *)in_stack_fffffffffffffbc0);
            std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                      ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_b8)
            ;
            sf::String::operator=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
            sf::String::~String((String *)0x1a247c);
            sf::String::~String((String *)0x1a2489);
            sf::String::~String((String *)0x1a2496);
          }
          else {
            std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                      ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_b8)
            ;
            sf::String::substring
                      (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                       (size_t)in_stack_fffffffffffffbd8);
            std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                      ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_b8)
            ;
            sf::String::operator=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
            sf::String::~String((String *)0x1a257c);
          }
        }
        else if ((local_a8 < local_b8) && (local_b8 < local_98)) {
          std::vector<sf::String,_std::allocator<sf::String>_>::begin
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffb98);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_const*,std::vector<sf::String,std::allocator<sf::String>>>::
          __normal_iterator<sf::String*>
                    ((__normal_iterator<const_sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffba0,
                     (__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffb98);
          std::vector<sf::String,_std::allocator<sf::String>_>::erase
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffbb8);
        }
        else if (local_b8 == local_98) {
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                     local_a8 + 1);
          sf::String::substring
                    (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                     (size_t)in_stack_fffffffffffffbd8);
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),local_a8);
          sf::String::operator+=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          sf::String::~String((String *)0x1a270d);
          std::vector<sf::String,_std::allocator<sf::String>_>::begin
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffb98);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_const*,std::vector<sf::String,std::allocator<sf::String>>>::
          __normal_iterator<sf::String*>
                    ((__normal_iterator<const_sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffba0,
                     (__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffb98);
          std::vector<sf::String,_std::allocator<sf::String>_>::erase
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffbb8);
        }
      }
      local_89 = sf::operator!=((Vector2<unsigned_long> *)(in_RDI + 0x3b8),
                                (Vector2<unsigned_long> *)(in_RDI + 0x3d0));
      updateCaretPosition(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                          (bool)in_stack_fffffffffffffd57);
    }
    sVar6 = findCaretOffset(in_stack_fffffffffffffbe0,
                            (Vector2<unsigned_long> *)in_stack_fffffffffffffbd8);
    if (in_ESI == 10) {
      if (((*(long *)(in_RDI + 0x2e8) == 0) ||
          (sVar6 = anon_unknown.dwarf_12ad49::findStringsLength
                             ((vector<sf::String,_std::allocator<sf::String>_> *)
                              in_stack_fffffffffffffbc0), sVar6 < *(ulong *)(in_RDI + 0x2e8))) &&
         ((uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38),
          *(long *)(in_RDI + 0x2f0) == 0 ||
          (sVar7 = std::vector<sf::String,_std::allocator<sf::String>_>::size
                             ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328)),
          sVar7 < *(ulong *)(in_RDI + 0x2f0))))) {
        std::vector<sf::String,_std::allocator<sf::String>_>::begin
                  ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffb98);
        __gnu_cxx::
        __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
        operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                   *)CONCAT17(in_stack_fffffffffffffbaf,
                              CONCAT16(in_stack_fffffffffffffbae,
                                       CONCAT15(in_stack_fffffffffffffbad,
                                                CONCAT14(in_stack_fffffffffffffbac,
                                                         in_stack_fffffffffffffba8)))),
                  (difference_type)in_stack_fffffffffffffba0);
        __gnu_cxx::
        __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
        operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                   *)CONCAT17(in_stack_fffffffffffffbaf,
                              CONCAT16(in_stack_fffffffffffffbae,
                                       CONCAT15(in_stack_fffffffffffffbad,
                                                CONCAT14(in_stack_fffffffffffffbac,
                                                         in_stack_fffffffffffffba8)))),
                  (difference_type)in_stack_fffffffffffffba0);
        __gnu_cxx::
        __normal_iterator<sf::String_const*,std::vector<sf::String,std::allocator<sf::String>>>::
        __normal_iterator<sf::String*>
                  ((__normal_iterator<const_sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                    *)in_stack_fffffffffffffba0,
                   (__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                    *)in_stack_fffffffffffffb98);
        std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                  ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                   *(size_type *)(in_RDI + 0x390));
        sf::String::substring
                  (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                   (size_t)in_stack_fffffffffffffbd8);
        __position._M_current._4_1_ = in_stack_fffffffffffffbac;
        __position._M_current._0_4_ = in_stack_fffffffffffffba8;
        __position._M_current._5_1_ = in_stack_fffffffffffffbad;
        __position._M_current._6_1_ = in_stack_fffffffffffffbae;
        __position._M_current._7_1_ = in_stack_fffffffffffffbaf;
        std::vector<sf::String,_std::allocator<sf::String>_>::emplace<sf::String>
                  ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffba0,
                   __position,in_stack_fffffffffffffb98);
        sf::String::~String((String *)0x1a2a1e);
        std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                  ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                   *(size_type *)(in_RDI + 0x390));
        sf::String::substring
                  (in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0,
                   (size_t)in_stack_fffffffffffffbd8);
        std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                  ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                   *(size_type *)(in_RDI + 0x390));
        sf::String::operator=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        sf::String::~String((String *)0x1a2a9e);
        updateCaretPosition(in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8._M_current,
                            (bool)uVar9);
        local_89 = true;
      }
    }
    else if (in_ESI == 8) {
      if ((local_89 == false) && (sVar6 != 0)) {
        if (*(long *)(in_RDI + 0x388) == 0) {
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                     *(size_type *)(in_RDI + 0x390));
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                     *(long *)(in_RDI + 0x390) - 1);
          sf::String::operator+=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          in_stack_fffffffffffffc40 =
               (vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328);
          std::vector<sf::String,_std::allocator<sf::String>_>::begin
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffb98);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_const*,std::vector<sf::String,std::allocator<sf::String>>>::
          __normal_iterator<sf::String*>
                    ((__normal_iterator<const_sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffba0,
                     (__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffb98);
          std::vector<sf::String,_std::allocator<sf::String>_>::erase
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbb0,
                     in_stack_fffffffffffffbb8);
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
        }
        else {
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                     *(size_type *)(in_RDI + 0x390));
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
          sf::String::erase((String *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                            0x1a2c86);
        }
        if ((*(long *)(in_RDI + 0x378) != 0) &&
           (lVar1 = *(long *)(in_RDI + 0x2d8), lVar2 = *(long *)(in_RDI + 0x378),
           in_stack_fffffffffffffc38 =
                (vector<sf::String,_std::allocator<sf::String>_> *)
                anon_unknown.dwarf_12ad49::findLongestLength
                          ((vector<sf::String,_std::allocator<sf::String>_> *)
                           in_stack_fffffffffffffbc0),
           in_stack_fffffffffffffc38 <
           (vector<sf::String,_std::allocator<sf::String>_> *)(lVar2 + lVar1))) {
          *(long *)(in_RDI + 0x378) = *(long *)(in_RDI + 0x378) + -1;
        }
        updateCaretPosition(in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8._M_current,
                            (bool)uVar9);
        local_89 = true;
      }
    }
    else if (in_ESI == 9) {
      uVar3 = *(ulong *)(in_RDI + 0x388);
      uVar11 = 9;
      for (local_248 = 0; local_248 < 4 - (uVar3 & 3); local_248 = local_248 + 1) {
        in_stack_fffffffffffffc2f =
             insertCharacter((MultilineTextBox *)CONCAT44(uVar11,uVar10),in_stack_ffffffffffffffe4,
                             (bool)in_stack_ffffffffffffffe3);
        in_stack_fffffffffffffc2e = true;
        if (!(bool)in_stack_fffffffffffffc2f) {
          in_stack_fffffffffffffc2e = local_89;
        }
        local_89 = (bool)in_stack_fffffffffffffc2e;
      }
    }
    else if (in_ESI == 0x7f) {
      if ((local_89 == false) &&
         (sVar8 = anon_unknown.dwarf_12ad49::findStringsLength
                            ((vector<sf::String,_std::allocator<sf::String>_> *)
                             in_stack_fffffffffffffbc0), sVar6 < sVar8)) {
        sVar6 = *(size_t *)(in_RDI + 0x388);
        std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                  ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                   *(size_type *)(in_RDI + 0x390));
        sVar8 = sf::String::getSize((String *)0x1a2e7c);
        if (sVar6 == sVar8) {
          in_stack_fffffffffffffbf8 = (String *)(in_RDI + 0x328);
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbf8,
                     *(long *)(in_RDI + 0x390) + 1);
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbf8,
                     *(size_type *)(in_RDI + 0x390));
          sf::String::operator+=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
          in_stack_fffffffffffffbe8 = (String *)(in_RDI + 0x328);
          std::vector<sf::String,_std::allocator<sf::String>_>::begin
                    ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffb98);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>::
          operator+((__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbaf,
                                CONCAT16(in_stack_fffffffffffffbae,
                                         CONCAT15(in_stack_fffffffffffffbad,
                                                  CONCAT14(in_stack_fffffffffffffbac,
                                                           in_stack_fffffffffffffba8)))),
                    (difference_type)in_stack_fffffffffffffba0);
          __gnu_cxx::
          __normal_iterator<sf::String_const*,std::vector<sf::String,std::allocator<sf::String>>>::
          __normal_iterator<sf::String*>
                    ((__normal_iterator<const_sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffba0,
                     (__normal_iterator<sf::String_*,_std::vector<sf::String,_std::allocator<sf::String>_>_>
                      *)in_stack_fffffffffffffb98);
          in_stack_fffffffffffffbf0 =
               std::vector<sf::String,_std::allocator<sf::String>_>::erase
                         ((vector<sf::String,_std::allocator<sf::String>_> *)
                          in_stack_fffffffffffffbb0,in_stack_fffffffffffffbb8);
        }
        else {
          std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                    ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                     *(size_type *)(in_RDI + 0x390));
          sf::String::erase((String *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                            0x1a2fc5);
        }
        if (*(long *)(in_RDI + 0x378) != 0) {
          in_stack_fffffffffffffbd8 =
               (MultilineTextBox *)(*(long *)(in_RDI + 0x378) + *(long *)(in_RDI + 0x2d8));
          in_stack_fffffffffffffbe0 =
               (MultilineTextBox *)
               anon_unknown.dwarf_12ad49::findLongestLength
                         ((vector<sf::String,_std::allocator<sf::String>_> *)
                          in_stack_fffffffffffffbc0);
          if (in_stack_fffffffffffffbe0 < in_stack_fffffffffffffbd8) {
            *(long *)(in_RDI + 0x378) = *(long *)(in_RDI + 0x378) + -1;
          }
        }
        updateCaretPosition(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                            (bool)in_stack_fffffffffffffd57);
        local_89 = true;
      }
    }
    else if ((*(long *)(in_RDI + 0x2e8) == 0) ||
            (in_stack_fffffffffffffbd0 =
                  (Signal<gui::Widget_*,_unsigned_long> *)
                  anon_unknown.dwarf_12ad49::findStringsLength
                            ((vector<sf::String,_std::allocator<sf::String>_> *)
                             in_stack_fffffffffffffbc0),
            in_stack_fffffffffffffbd0 < *(Signal<gui::Widget_*,_unsigned_long> **)(in_RDI + 0x2e8)))
    {
      in_stack_fffffffffffffbc0 =
           (MultilineTextBox *)
           std::vector<sf::String,_std::allocator<sf::String>_>::operator[]
                     ((vector<sf::String,_std::allocator<sf::String>_> *)(in_RDI + 0x328),
                      *(size_type *)(in_RDI + 0x390));
      in_stack_fffffffffffffbc8 = *(Widget **)(in_RDI + 0x388);
      sf::String::String((String *)in_stack_fffffffffffffbb0,
                         CONCAT13(in_stack_fffffffffffffbaf,
                                  CONCAT12(in_stack_fffffffffffffbae,
                                           CONCAT11(in_stack_fffffffffffffbad,
                                                    in_stack_fffffffffffffbac))));
      uVar9 = (undefined1)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
      sf::String::insert((String *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                         (String *)0x1a310b);
      sf::String::~String((String *)0x1a311a);
      updateCaretPosition(in_stack_fffffffffffffbc0,(size_t)in_stack_fffffffffffffbb8._M_current,
                          (bool)uVar9);
      local_89 = true;
    }
    __s = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
          (in_RDI + 0x300);
    std::locale::locale(local_2b8);
    sf::String::String(in_stack_fffffffffffffbf0._M_current,(char *)in_stack_fffffffffffffbe8,
                       (locale *)in_stack_fffffffffffffbe0);
    bVar5 = sf::operator!=((String *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    sf::String::~String((String *)0x1a31d3);
    std::locale::~locale(local_2b8);
    if ((bVar5 & 1) != 0) {
      sf::String::toWideString_abi_cxx11_(in_stack_fffffffffffffbf8);
      std::__cxx11::basic_regex<wchar_t,std::__cxx11::regex_traits<wchar_t>>::
      basic_regex<std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                 in_stack_fffffffffffffbe0,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 in_stack_fffffffffffffbd8,(flag_type)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
      std::__cxx11::wstring::~wstring(local_2f8);
      anon_unknown.dwarf_12ad49::combineStrings
                ((vector<sf::String,_std::allocator<sf::String>_> *)
                 CONCAT17(in_stack_fffffffffffffc2f,
                          CONCAT16(in_stack_fffffffffffffc2e,in_stack_fffffffffffffc28)));
      sf::String::toWideString_abi_cxx11_(in_stack_fffffffffffffbf8);
      bVar4 = std::
              regex_match<std::char_traits<wchar_t>,std::allocator<wchar_t>,wchar_t,std::__cxx11::regex_traits<wchar_t>>
                        (__s,(basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_> *)
                             CONCAT17(bVar5,CONCAT16(in_stack_fffffffffffffbae,
                                                     CONCAT15(in_stack_fffffffffffffbad,
                                                              CONCAT14(in_stack_fffffffffffffbac,
                                                                       in_stack_fffffffffffffba8))))
                         ,(match_flag_type)((ulong)in_stack_fffffffffffffba0 >> 0x20));
      bVar5 = bVar4 ^ 0xff;
      std::__cxx11::wstring::~wstring(local_318);
      sf::String::~String((String *)0x1a32aa);
      if ((bVar5 & 1) != 0) {
        std::vector<sf::String,_std::allocator<sf::String>_>::operator=
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        *(unsigned_long *)(in_RDI + 0x378) = local_40[0].x;
        *(unsigned_long *)(in_RDI + 0x380) = local_40[0].y;
        updateCaretPosition(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                            (bool)in_stack_fffffffffffffd57);
        local_89 = false;
      }
      std::__cxx11::basic_regex<wchar_t,_std::__cxx11::regex_traits<wchar_t>_>::~basic_regex
                (in_stack_fffffffffffffba0);
    }
    if ((local_89 != false) && ((uVar10 & 0x1000000) == 0)) {
      anon_unknown.dwarf_12ad49::findStringsLength
                ((vector<sf::String,_std::allocator<sf::String>_> *)in_stack_fffffffffffffbc0);
      Signal<gui::Widget_*,_unsigned_long>::emit
                (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,
                 (unsigned_long)in_stack_fffffffffffffbc0);
    }
    local_1 = local_89;
    std::vector<sf::String,_std::allocator<sf::String>_>::~vector
              ((vector<sf::String,_std::allocator<sf::String>_> *)__s);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MultilineTextBox::insertCharacter(uint32_t unicode, bool suppressSignals) {
    if (readOnly_) {
        return false;
    }
    // For a regex pattern, first backup the state that we need to restore if the pattern match fails.
    std::vector<sf::String> lastBoxStrings;
    sf::Vector2<size_t> lastScroll, lastCaretPosition;
    if (regexPattern_ != ".*") {
        lastBoxStrings = boxStrings_;
        lastScroll = scroll_;
        lastCaretPosition = caretPosition_;
    }

    // Check if the selection will be replaced.
    bool textChanged = false, clearedSelection = false;
    if (selectionStart_.second) {
        auto selection = sortByYFirst(selectionStart_.first, selectionEnd_);
        for (size_t y = selection.first.y; y <= selection.second.y; ++y) {
            if (y == selection.first.y) {
                if (y == selection.second.y) {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x) + boxStrings_[y].substring(selection.second.x);
                } else {
                    boxStrings_[y] = boxStrings_[y].substring(0, selection.first.x);
                }
            } else if (y > selection.first.y && y < selection.second.y) {
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            } else if (y == selection.second.y) {
                boxStrings_[selection.first.y] += boxStrings_[selection.first.y + 1].substring(selection.second.x);
                boxStrings_.erase(boxStrings_.begin() + selection.first.y + 1);
            }
        }
        if (selectionStart_.first != selectionEnd_) {
            textChanged = true;
            clearedSelection = true;
        }
        updateCaretPosition(selection.first, false);
    }
    size_t caretOffset = findCaretOffset(caretPosition_);

    if (unicode == '\u000a') {    // Enter key.
        if ((maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) && (maxLines_ == 0 || boxStrings_.size() < maxLines_)) {
            boxStrings_.emplace(boxStrings_.begin() + caretPosition_.y + 1, boxStrings_[caretPosition_.y].substring(caretPosition_.x));
            boxStrings_[caretPosition_.y] = boxStrings_[caretPosition_.y].substring(0, caretPosition_.x);
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0008') {    // Backspace key.
        if (!clearedSelection && caretOffset > 0) {
            if (caretPosition_.x == 0) {
                boxStrings_[caretPosition_.y - 1] += boxStrings_[caretPosition_.y];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x - 1, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretOffset - 1, false);
            textChanged = true;
        }
    } else if (unicode == '\u0009') {    // Tab key.
        size_t count = 4 - caretPosition_.x % 4;
        for (size_t i = 0; i < count; ++i) {
            textChanged = insertCharacter(' ', true) || textChanged;
        }
    } else if (unicode == '\u007f') {    // Delete key.
        if (!clearedSelection && caretOffset < findStringsLength(boxStrings_)) {
            if (caretPosition_.x == boxStrings_[caretPosition_.y].getSize()) {
                boxStrings_[caretPosition_.y] += boxStrings_[caretPosition_.y + 1];
                boxStrings_.erase(boxStrings_.begin() + caretPosition_.y + 1);
            } else {
                boxStrings_[caretPosition_.y].erase(caretPosition_.x, 1);
            }
            if (scroll_.x > 0 && scroll_.x + sizeCharacters_.x > findLongestLength(boxStrings_)) {
                --scroll_.x;
            }
            updateCaretPosition(caretPosition_, false);
            textChanged = true;
        }
    } else {    // Printable character.
        if (maxCharacters_ == 0 || findStringsLength(boxStrings_) < maxCharacters_) {
            boxStrings_[caretPosition_.y].insert(caretPosition_.x, sf::String(unicode));
            updateCaretPosition(caretOffset + 1, false);
            textChanged = true;
        }
    }

    if (regexPattern_ != ".*") {
        std::wregex regex(regexPattern_.toWideString());
        if (!std::regex_match(combineStrings(boxStrings_).toWideString(), regex)) {
            GUI_DEBUG << "Regex pattern match failed, discarding character input.\n";
            boxStrings_ = lastBoxStrings;
            scroll_ = lastScroll;
            updateCaretPosition(lastCaretPosition, false);
            textChanged = false;
        }
    }

    if (textChanged && !suppressSignals) {
        onTextChange.emit(this, findStringsLength(boxStrings_));
    }
    return textChanged;
}